

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O0

FT_Error tt_face_load_name(TT_Face face,FT_Stream stream)

{
  FT_UShort FVar1;
  FT_Error FVar2;
  TT_NameTableRec *structure;
  ulong uVar3;
  TT_LangTagRec *pTVar4;
  TT_NameRec *pTVar5;
  FT_UInt local_6c;
  TT_NameRec *pTStack_68;
  FT_UInt count;
  TT_Name entry_1;
  TT_LangTag limit;
  TT_LangTag entry;
  TT_NameTable table;
  FT_ULong storage_limit;
  FT_ULong storage_start;
  FT_ULong table_len;
  FT_ULong table_pos;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  table_pos = (FT_ULong)stream->memory;
  structure = &face->name_table;
  (face->name_table).stream = stream;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x6e616d65,stream,&storage_start);
  if (memory._4_4_ == 0) {
    table_len = FT_Stream_Pos(pFStack_18);
    memory._4_4_ = FT_Stream_ReadFields(pFStack_18,tt_face_load_name::name_table_fields,structure);
    if (memory._4_4_ == 0) {
      storage_limit = table_len + 6 + (ulong)((face->name_table).numNameRecords * 0xc);
      uVar3 = table_len + storage_start;
      if (uVar3 < storage_limit) {
        memory._4_4_ = 0x91;
      }
      else {
        if (structure->format == 1) {
          memory._4_4_ = FT_Stream_Seek(pFStack_18,storage_limit);
          if (memory._4_4_ != 0) {
            return memory._4_4_;
          }
          FVar1 = FT_Stream_ReadUShort(pFStack_18,(FT_Error *)((long)&memory + 4));
          (face->name_table).numLangTagRecords = (uint)FVar1;
          if (memory._4_4_ != 0) {
            return memory._4_4_;
          }
          storage_limit = ((face->name_table).numLangTagRecords * 4 + 2) + storage_limit;
          pTVar4 = (TT_LangTagRec *)
                   ft_mem_realloc((FT_Memory)table_pos,0x18,0,
                                  (ulong)(face->name_table).numLangTagRecords,(void *)0x0,
                                  (FT_Error *)((long)&memory + 4));
          (face->name_table).langTags = pTVar4;
          if (memory._4_4_ != 0) {
            return memory._4_4_;
          }
          FVar2 = FT_Stream_EnterFrame
                            (pFStack_18,(ulong)((face->name_table).numLangTagRecords << 2));
          if (FVar2 != 0) {
            return FVar2;
          }
          limit = (face->name_table).langTags;
          pTVar4 = limit + (face->name_table).numLangTagRecords;
          memory._4_4_ = 0;
          for (; limit < pTVar4; limit = limit + 1) {
            memory._4_4_ = FT_Stream_ReadFields
                                     (pFStack_18,tt_face_load_name::langTag_record_fields,limit);
            limit->stringOffset = table_len + (face->name_table).storageOffset + limit->stringOffset
            ;
            if ((limit->stringOffset < storage_limit) ||
               (uVar3 < limit->stringOffset + (ulong)limit->stringLength)) {
              limit->stringLength = 0;
            }
          }
          FT_Stream_ExitFrame(pFStack_18);
          memory._4_4_ = FT_Stream_Seek(pFStack_18,table_len + 6);
        }
        pTVar5 = (TT_NameRec *)
                 ft_mem_realloc((FT_Memory)table_pos,0x20,0,(ulong)(face->name_table).numNameRecords
                                ,(void *)0x0,(FT_Error *)((long)&memory + 4));
        (face->name_table).names = pTVar5;
        if ((memory._4_4_ == 0) &&
           (memory._4_4_ = FT_Stream_EnterFrame
                                     (pFStack_18,(ulong)((face->name_table).numNameRecords * 0xc)),
           memory._4_4_ == 0)) {
          pTStack_68 = (face->name_table).names;
          for (local_6c = (face->name_table).numNameRecords; local_6c != 0; local_6c = local_6c - 1)
          {
            memory._4_4_ = FT_Stream_ReadFields
                                     (pFStack_18,tt_face_load_name::name_record_fields,pTStack_68);
            if ((((memory._4_4_ == 0) && (pTStack_68->stringLength != 0)) &&
                (pTStack_68->stringOffset =
                      table_len + (face->name_table).storageOffset + pTStack_68->stringOffset,
                storage_limit <= pTStack_68->stringOffset)) &&
               ((pTStack_68->stringOffset + (ulong)pTStack_68->stringLength <= uVar3 &&
                (((structure->format != 1 || (pTStack_68->languageID < 0x8000)) ||
                 ((pTStack_68->languageID - 0x8000 < (face->name_table).numLangTagRecords &&
                  ((face->name_table).langTags[pTStack_68->languageID - 0x8000].stringLength != 0)))
                 ))))) {
              pTStack_68 = pTStack_68 + 1;
            }
          }
          uVar3 = (long)pTStack_68 - (long)(face->name_table).names >> 5;
          pTVar5 = (TT_NameRec *)
                   ft_mem_realloc((FT_Memory)table_pos,0x20,(ulong)(face->name_table).numNameRecords
                                  ,uVar3 & 0xffffffff,(face->name_table).names,
                                  (FT_Error *)((long)&memory + 4));
          (face->name_table).names = pTVar5;
          (face->name_table).numNameRecords = (FT_UInt)uVar3;
          FT_Stream_ExitFrame(pFStack_18);
          *(short *)&stream_local[7].base = (short)(face->name_table).numNameRecords;
        }
      }
    }
  }
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_name( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error      error;
    FT_Memory     memory = stream->memory;
    FT_ULong      table_pos, table_len;
    FT_ULong      storage_start, storage_limit;
    TT_NameTable  table;

    static const FT_Frame_Field  name_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameTableRec

      FT_FRAME_START( 6 ),
        FT_FRAME_USHORT( format ),
        FT_FRAME_USHORT( numNameRecords ),
        FT_FRAME_USHORT( storageOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  name_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( platformID ),
        FT_FRAME_USHORT( encodingID ),
        FT_FRAME_USHORT( languageID ),
        FT_FRAME_USHORT( nameID ),
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  langTag_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_LangTagRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };


    table         = &face->name_table;
    table->stream = stream;

    error = face->goto_table( face, TTAG_name, stream, &table_len );
    if ( error )
      goto Exit;

    table_pos = FT_STREAM_POS();

    if ( FT_STREAM_READ_FIELDS( name_table_fields, table ) )
      goto Exit;

    /* Some popular Asian fonts have an invalid `storageOffset' value (it */
    /* should be at least `6 + 12*numNameRecords').  However, the string  */
    /* offsets, computed as `storageOffset + entry->stringOffset', are    */
    /* valid pointers within the name table...                            */
    /*                                                                    */
    /* We thus can't check `storageOffset' right now.                     */
    /*                                                                    */
    storage_start = table_pos + 6 + 12 * table->numNameRecords;
    storage_limit = table_pos + table_len;

    if ( storage_start > storage_limit )
    {
      FT_ERROR(( "tt_face_load_name: invalid `name' table\n" ));
      error = FT_THROW( Name_Table_Missing );
      goto Exit;
    }

    /* `name' format 1 contains additional language tag records, */
    /* which we load first                                       */
    if ( table->format == 1 )
    {
      if ( FT_STREAM_SEEK( storage_start )            ||
           FT_READ_USHORT( table->numLangTagRecords ) )
        goto Exit;

      storage_start += 2 + 4 * table->numLangTagRecords;

      /* allocate language tag records array */
      if ( FT_NEW_ARRAY( table->langTags, table->numLangTagRecords ) ||
           FT_FRAME_ENTER( table->numLangTagRecords * 4 )            )
        goto Exit;

      /* load language tags */
      {
        TT_LangTag  entry = table->langTags;
        TT_LangTag  limit = entry + table->numLangTagRecords;


        for ( ; entry < limit; entry++ )
        {
          (void)FT_STREAM_READ_FIELDS( langTag_record_fields, entry );

          /* check that the langTag string is within the table */
          entry->stringOffset += table_pos + table->storageOffset;
          if ( entry->stringOffset                       < storage_start ||
               entry->stringOffset + entry->stringLength > storage_limit )
          {
            /* invalid entry; ignore it */
            entry->stringLength = 0;
          }
        }
      }

      FT_FRAME_EXIT();

      (void)FT_STREAM_SEEK( table_pos + 6 );
    }

    /* allocate name records array */
    if ( FT_NEW_ARRAY( table->names, table->numNameRecords ) ||
         FT_FRAME_ENTER( table->numNameRecords * 12 )        )
      goto Exit;

    /* load name records */
    {
      TT_Name  entry = table->names;
      FT_UInt  count = table->numNameRecords;


      for ( ; count > 0; count-- )
      {
        if ( FT_STREAM_READ_FIELDS( name_record_fields, entry ) )
          continue;

        /* check that the name is not empty */
        if ( entry->stringLength == 0 )
          continue;

        /* check that the name string is within the table */
        entry->stringOffset += table_pos + table->storageOffset;
        if ( entry->stringOffset                       < storage_start ||
             entry->stringOffset + entry->stringLength > storage_limit )
        {
          /* invalid entry; ignore it */
          continue;
        }

        /* assure that we have a valid language tag ID, and   */
        /* that the corresponding langTag entry is valid, too */
        if ( table->format == 1 && entry->languageID >= 0x8000U )
        {
          if ( entry->languageID - 0x8000U >= table->numLangTagRecords    ||
               !table->langTags[entry->languageID - 0x8000U].stringLength )
          {
            /* invalid entry; ignore it */
            continue;
          }
        }

        entry++;
      }

      /* reduce array size to the actually used elements */
      count = (FT_UInt)( entry - table->names );
      (void)FT_RENEW_ARRAY( table->names,
                            table->numNameRecords,
                            count );
      table->numNameRecords = count;
    }

    FT_FRAME_EXIT();

    /* everything went well, update face->num_names */
    face->num_names = (FT_UShort)table->numNameRecords;

  Exit:
    return error;
  }